

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O3

void diy::
     Serialization<std::vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>_>
     ::load(BinaryBuffer *bb,Vector *v)

{
  pointer x;
  size_type sVar1;
  size_t s;
  size_type local_170;
  Description local_168;
  
  (*bb->_vptr_BinaryBuffer[4])(bb,&local_170,8);
  sVar1 = local_170;
  memset(&local_168,0,0x148);
  AMRLink::Description::Description(&local_168);
  Catch::clara::std::vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>::
  resize(v,sVar1,&local_168);
  local_168.bounds.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       local_168.bounds.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (local_168.bounds.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(local_168.bounds.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    local_168.bounds.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  local_168.bounds.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       local_168.bounds.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (local_168.bounds.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(local_168.bounds.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    local_168.bounds.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  local_168.core.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       local_168.core.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (local_168.core.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(local_168.core.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    local_168.core.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  local_168.core.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       local_168.core.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (local_168.core.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(local_168.core.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    local_168.core.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  local_168.refinement.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       local_168.refinement.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (local_168.refinement.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(local_168.refinement.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    local_168.refinement.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  if (local_170 != 0) {
    x = (v->
        super__Vector_base<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>).
        _M_impl.super__Vector_impl_data._M_start;
    sVar1 = local_170;
    do {
      Serialization<diy::AMRLink::Description>::load(bb,x);
      x = x + 1;
      sVar1 = sVar1 - 1;
    } while (sVar1 != 0);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }